

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

void reg_push(lgx_compiler_t *c,lgx_ast_node_t *node,uchar reg)

{
  while( true ) {
    if (c == (lgx_compiler_t *)0x0) {
      __assert_fail("node",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/compiler/compiler.c"
                    ,0x45,"void reg_push(lgx_compiler_t *, lgx_ast_node_t *, unsigned char)");
    }
    if (*(char *)&c->ast == '\x18') break;
    c = *(lgx_compiler_t **)&c->bc;
  }
  lgx_reg_push((lgx_reg_t *)(c->constant).tail,(uchar)node);
  return;
}

Assistant:

static void reg_push(lgx_compiler_t* c, lgx_ast_node_t *node, unsigned char reg) {
    node = find_function(node);
    assert(node);

    lgx_reg_push(node->u.regs, reg);
}